

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O1

void __thiscall
testing::internal::DefaultGlobalTestPartResultReporter::ReportTestPartResult
          (DefaultGlobalTestPartResultReporter *this,TestPartResult *result)

{
  TestInfo *pTVar1;
  TestEventRepeater *pTVar2;
  TestResult *pTVar3;
  
  pTVar1 = this->unit_test_->current_test_info_;
  pTVar3 = &this->unit_test_->ad_hoc_test_result_;
  if (pTVar1 != (TestInfo *)0x0) {
    pTVar3 = &pTVar1->result_;
  }
  std::vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>::push_back
            (&pTVar3->test_part_results_,result);
  pTVar2 = (this->unit_test_->listeners_).repeater_;
  (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[8])(pTVar2,result);
  return;
}

Assistant:

void DefaultGlobalTestPartResultReporter::ReportTestPartResult(
			const TestPartResult& result) {
			unit_test_->current_test_result()->AddTestPartResult(result);
			unit_test_->listeners()->repeater()->OnTestPartResult(result);
		}